

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackIFWGenerator::WriteGeneratedByToStrim(cmCPackIFWGenerator *this,cmGeneratedFileStream *xout)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_61;
  string local_60;
  cmTimestamp local_39;
  string local_38;
  cmGeneratedFileStream *local_18;
  cmGeneratedFileStream *xout_local;
  cmCPackIFWGenerator *this_local;
  
  local_18 = xout;
  xout_local = (cmGeneratedFileStream *)this;
  poVar2 = std::operator<<((ostream *)xout,"<!-- Generated by CPack ");
  poVar2 = std::operator<<(poVar2,"3.5.1");
  poVar2 = std::operator<<(poVar2," IFW generator ");
  std::operator<<(poVar2,"for QtIFW ");
  bVar1 = IsVersionLess(this,"2.0");
  if (bVar1) {
    std::operator<<((ostream *)local_18,"less 2.0");
  }
  else {
    std::operator<<((ostream *)local_18,(string *)&this->FrameworkVersion);
  }
  poVar2 = std::operator<<((ostream *)local_18," tools at ");
  cmTimestamp::cmTimestamp(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",&local_61);
  cmTimestamp::CurrentTime(&local_38,&local_39,&local_60,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  poVar2 = std::operator<<(poVar2," -->");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void cmCPackIFWGenerator::WriteGeneratedByToStrim(cmGeneratedFileStream &xout)
{
  xout << "<!-- Generated by CPack " << CMake_VERSION << " IFW generator "
       << "for QtIFW ";
  if(IsVersionLess("2.0"))
    {
    xout << "less 2.0";
    }
  else
    {
    xout << FrameworkVersion;
    }
  xout << " tools at " << cmTimestamp().CurrentTime("", true) << " -->"
       << std::endl;
}